

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseCodeMetadataAnnotation(WastParser *this,ExprList *exprs)

{
  Expr *pEVar1;
  size_t sVar2;
  char *pcVar3;
  Result RVar4;
  TokenType TVar5;
  Expr *node_p;
  Expr *pEVar6;
  ExprList *pEVar7;
  Enum EVar8;
  string data_text;
  Token tk;
  string local_e8;
  Expr *local_c8;
  size_t sStack_c0;
  char *local_b8;
  Token local_b0;
  Token local_70;
  
  Consume(&local_b0,this);
  if (5 < local_b0.token_type_ - AlignEqNat) {
    __assert_fail("HasText()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/token.h"
                  ,99,"std::string_view wabt::Token::text() const");
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  RVar4 = ParseQuotedText(this,&local_e8,false);
  EVar8 = Error;
  if (RVar4.enum_ != Error) {
    local_c8 = (Expr *)0x0;
    sStack_c0 = 0;
    local_b8 = (char *)0x0;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_initialize<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c8,
               local_e8._M_dataplus._M_p,local_e8._M_dataplus._M_p + local_e8._M_string_length);
    pEVar6 = (Expr *)operator_new(0x68);
    pcVar3 = local_b8;
    sVar2 = sStack_c0;
    pEVar1 = local_c8;
    local_b8 = (char *)0x0;
    local_c8 = (Expr *)0x0;
    sStack_c0 = 0;
    *(undefined8 *)((long)&(pEVar6->loc).filename._M_str + 4) = 0;
    *(undefined8 *)((long)&(pEVar6->loc).field_1.field_1.offset + 4) = 0;
    (pEVar6->loc).filename._M_len = 0;
    (pEVar6->loc).filename._M_str = (char *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->type_ = CodeMetadata;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__CodeMetadataExpr_0018ad48;
    pEVar6[1]._vptr_Expr = (_func_int **)(local_b0.field_2.text_._M_len - 0xe);
    pEVar6[1].super_intrusive_list_base<wabt::Expr>.next_ =
         (Expr *)(local_b0.field_2.literal_.text._M_len + 0xe);
    pEVar6[1].super_intrusive_list_base<wabt::Expr>.prev_ = pEVar1;
    pEVar6[1].loc.filename._M_len = sVar2;
    pEVar6[1].loc.filename._M_str = pcVar3;
    pEVar1 = exprs->last_;
    pEVar7 = exprs;
    if (pEVar1 != (Expr *)0x0) {
      (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar1;
      pEVar7 = (ExprList *)&pEVar1->super_intrusive_list_base<wabt::Expr>;
    }
    pEVar7->first_ = pEVar6;
    exprs->last_ = pEVar6;
    exprs->size_ = exprs->size_ + 1;
    TVar5 = Peek(this,0);
    if (TVar5 != Rpar) {
      __assert_fail("rpar == TokenType::Rpar",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                    ,0x7a9,"Result wabt::WastParser::ParseCodeMetadataAnnotation(ExprList *)");
    }
    Consume(&local_70,this);
    if (local_c8 != (Expr *)0x0) {
      operator_delete(local_c8,(long)local_b8 - (long)local_c8);
    }
    EVar8 = Ok;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  return (Result)EVar8;
}

Assistant:

Result WastParser::ParseCodeMetadataAnnotation(ExprList* exprs) {
  WABT_TRACE(ParseCodeMetadataAnnotation);
  Token tk = Consume();
  std::string_view name = tk.text();
  name.remove_prefix(sizeof("metadata.code.") - 1);
  std::string data_text;
  CHECK_RESULT(ParseQuotedText(&data_text, false));
  std::vector<uint8_t> data(data_text.begin(), data_text.end());
  exprs->push_back(std::make_unique<CodeMetadataExpr>(name, std::move(data)));
  TokenType rpar = Peek();
  WABT_USE(rpar);
  assert(rpar == TokenType::Rpar);
  Consume();
  return Result::Ok;
}